

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O0

bool __thiscall
Js::AsmJsModuleCompiler::SetupFunctionArguments
          (AsmJsModuleCompiler *this,AsmJsFunc *func,ParseNodePtr pnode)

{
  ParseNode *pPVar1;
  ArgSlot index_00;
  bool bVar2;
  PropertyId PVar3;
  PropertyId PVar4;
  RegSlot RVar5;
  PropertyName pIVar6;
  ParseNodeInt *pPVar7;
  IdentPtr name;
  LPCOLESTR pOVar8;
  AsmJsVarType local_a9;
  AsmJsFunctionDeclaration *local_a8;
  AsmJsFunctionDeclaration *funcDecl;
  ParseNodeCall *callNode;
  ParseNode *intSym;
  ParseNode *argSym_1;
  ParseNode *local_80;
  ParseNode *argSym;
  ParseNode *local_70;
  ParseNode *rhs;
  ParseNode *lhs;
  ParseNode *argDefinition;
  AsmJsVarBase *var;
  PropertyName argName;
  ParseNode *pPStack_40;
  ArgSlot index;
  ParseNode *argNode;
  ParseNode *fncNode;
  ParseNodePtr pPStack_28;
  ArgSlot numArguments;
  ParseNodePtr pnode_local;
  AsmJsFunc *func_local;
  AsmJsModuleCompiler *this_local;
  
  fncNode._6_2_ = 0;
  pPStack_28 = pnode;
  pnode_local = (ParseNodePtr)func;
  func_local = (AsmJsFunc *)this;
  argNode = &AsmJsFunc::GetFncNode(func)->super_ParseNode;
  pPStack_40 = ParserWrapper::FunctionArgsList(argNode,(ArgSlot *)((long)&fncNode + 6));
  bVar2 = AsmJsFunctionDeclaration::EnsureArgCount
                    ((AsmJsFunctionDeclaration *)pnode_local,fncNode._6_2_);
  if (bVar2) {
    argName._6_2_ = 0;
    while (pPStack_40 != (ParseNode *)0x0) {
      if (pPStack_28->nop != knopList) {
        bVar2 = Fail(this,pPStack_28,L"Missing assignment statement for argument");
        return bVar2;
      }
      bVar2 = ParserWrapper::IsDefinition(pPStack_40);
      if (!bVar2) {
        bVar2 = Fail(this,pPStack_40,L"duplicate argument name not allowed");
        return bVar2;
      }
      var = (AsmJsVarBase *)ParseNode::name(pPStack_40);
      bVar2 = AsmJSCompiler::CheckIdentifier(this,pPStack_40,(PropertyName)var);
      if (!bVar2) {
        return false;
      }
      argDefinition =
           (ParseNode *)AsmJsFunc::DefineVar((AsmJsFunc *)pnode_local,(PropertyName)var,true,true);
      if ((AsmJsVarBase *)argDefinition == (AsmJsVarBase *)0x0) {
        bVar2 = Fail(this,pPStack_40,L"Failed to define var");
        return bVar2;
      }
      lhs = ParserWrapper::GetBinaryLeft(pPStack_28);
      if (lhs->nop != knopAsg) {
        bVar2 = Fail(this,lhs,L"Expecting an assignment");
        return bVar2;
      }
      rhs = ParserWrapper::GetBinaryLeft(lhs);
      local_70 = ParserWrapper::GetBinaryRight(lhs);
      if (rhs->nop != knopName) {
LAB_00d7c9e6:
        bVar2 = Fail(this,rhs,L"Defining wrong argument");
        return bVar2;
      }
      pIVar6 = ParserWrapper::VariableName(rhs);
      PVar3 = Ident::GetPropertyId(pIVar6);
      pIVar6 = AsmJsSymbol::GetName((AsmJsSymbol *)argDefinition);
      PVar4 = Ident::GetPropertyId(pIVar6);
      pPVar1 = argDefinition;
      if (PVar3 != PVar4) goto LAB_00d7c9e6;
      if (local_70->nop == knopPos) {
        AsmJsVarType::AsmJsVarType((AsmJsVarType *)((long)&argSym + 7),Double);
        AsmJsVarBase::SetVarType((AsmJsVarBase *)pPVar1,(AsmJsVarType *)((long)&argSym + 7));
        pPVar1 = argDefinition;
        RVar5 = AsmJsFunc::AcquireRegister<double>((AsmJsFunc *)pnode_local);
        AsmJsVarBase::SetLocation((AsmJsVarBase *)pPVar1,RVar5);
        local_80 = ParserWrapper::GetUnaryNode(local_70);
        if (local_80->nop != knopName) {
LAB_00d7caaf:
          bVar2 = Fail(this,rhs,L"Defining wrong argument");
          return bVar2;
        }
        pIVar6 = ParserWrapper::VariableName(local_80);
        PVar3 = Ident::GetPropertyId(pIVar6);
        pIVar6 = AsmJsSymbol::GetName((AsmJsSymbol *)argDefinition);
        PVar4 = Ident::GetPropertyId(pIVar6);
        if (PVar3 != PVar4) goto LAB_00d7caaf;
      }
      else if (local_70->nop == knopOr) {
        AsmJsVarType::AsmJsVarType((AsmJsVarType *)((long)&argSym_1 + 7),Int);
        AsmJsVarBase::SetVarType((AsmJsVarBase *)pPVar1,(AsmJsVarType *)((long)&argSym_1 + 7));
        pPVar1 = argDefinition;
        RVar5 = AsmJsFunc::AcquireRegister<int>((AsmJsFunc *)pnode_local);
        AsmJsVarBase::SetLocation((AsmJsVarBase *)pPVar1,RVar5);
        intSym = ParserWrapper::GetBinaryLeft(local_70);
        callNode = (ParseNodeCall *)ParserWrapper::GetBinaryRight(local_70);
        if (intSym->nop != knopName) {
LAB_00d7cb93:
          bVar2 = Fail(this,rhs,L"Defining wrong argument");
          return bVar2;
        }
        pIVar6 = ParserWrapper::VariableName(intSym);
        PVar3 = Ident::GetPropertyId(pIVar6);
        pIVar6 = AsmJsSymbol::GetName((AsmJsSymbol *)argDefinition);
        PVar4 = Ident::GetPropertyId(pIVar6);
        if (PVar3 != PVar4) goto LAB_00d7cb93;
        if (((callNode->super_ParseNode).nop != knopInt) ||
           (pPVar7 = ParseNode::AsParseNodeInt(&callNode->super_ParseNode), pPVar7->lw != 0)) {
          bVar2 = Fail(this,rhs,L"Or value must be 0 when defining arguments");
          return bVar2;
        }
      }
      else {
        if (local_70->nop != knopCall) {
          bVar2 = Fail(this,local_70,L"arguments are not casted as valid Asm.js type");
          return bVar2;
        }
        funcDecl = (AsmJsFunctionDeclaration *)ParseNode::AsParseNodeCall(local_70);
        if ((*(ParseNodePtr *)&(funcDecl->super_AsmJsSymbol).mType)->nop != knopName) {
          bVar2 = Fail(this,local_70,L"call should be for fround");
          return bVar2;
        }
        name = ParseNode::name(*(ParseNode **)&(funcDecl->super_AsmJsSymbol).mType);
        local_a8 = LookupFunction(this,name);
        if (local_a8 == (AsmJsFunctionDeclaration *)0x0) {
          bVar2 = Fail(this,local_70,
                       L"Cannot resolve function for argument definition, or wrong function");
          return bVar2;
        }
        bVar2 = AsmJsMathFunction::Is(&local_a8->super_AsmJsSymbol);
        if (!bVar2) {
          bVar2 = Fail(this,local_70,L"Wrong function used for argument definition");
          return bVar2;
        }
        bVar2 = AsmJsMathFunction::IsFround(local_a8);
        pPVar1 = argDefinition;
        if (!bVar2) {
          bVar2 = Fail(this,local_70,L"call should be for fround");
          return bVar2;
        }
        AsmJsVarType::AsmJsVarType(&local_a9,Float);
        AsmJsVarBase::SetVarType((AsmJsVarBase *)pPVar1,&local_a9);
        pPVar1 = argDefinition;
        RVar5 = AsmJsFunc::AcquireRegister<float>((AsmJsFunc *)pnode_local);
        AsmJsVarBase::SetLocation((AsmJsVarBase *)pPVar1,RVar5);
        if ((*(short *)&funcDecl->mArgumentsType == 0) ||
           (**(char **)&funcDecl->mArgCount != '\x01')) {
LAB_00d7cdb8:
          bVar2 = Fail(this,rhs,L"Defining wrong argument");
          return bVar2;
        }
        pIVar6 = ParserWrapper::VariableName(*(ParseNode **)&funcDecl->mArgCount);
        PVar3 = Ident::GetPropertyId(pIVar6);
        pIVar6 = AsmJsSymbol::GetName((AsmJsSymbol *)argDefinition);
        PVar4 = Ident::GetPropertyId(pIVar6);
        if (PVar3 != PVar4) goto LAB_00d7cdb8;
      }
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ByteCodePhase);
      if (bVar2) {
        pOVar8 = Ident::Psz((Ident *)var);
        Output::Print(L"    Argument [%s] Valid",pOVar8);
      }
      index_00 = argName._6_2_;
      argName._6_2_ = argName._6_2_ + 1;
      bVar2 = AsmJsFunctionDeclaration::EnsureArgType
                        ((AsmJsFunctionDeclaration *)pnode_local,(AsmJsVarBase *)argDefinition,
                         index_00);
      if (!bVar2) {
        bVar2 = Fail(this,local_70,L"Unexpected argument type");
        return bVar2;
      }
      pPStack_40 = ParserWrapper::NextVar(pPStack_40);
      pPStack_28 = ParserWrapper::GetBinaryRight(pPStack_28);
    }
    AsmJsFunc::SetBodyNode((AsmJsFunc *)pnode_local,pPStack_28);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = Fail(this,pPStack_40,L"Cannot have variable number of arguments");
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsModuleCompiler::SetupFunctionArguments(AsmJsFunc * func, ParseNodePtr pnode)
    {
        // Check arguments
        ArgSlot numArguments = 0;
        ParseNode * fncNode = func->GetFncNode();
        ParseNode* argNode = ParserWrapper::FunctionArgsList(fncNode, numArguments);

        if (!func->EnsureArgCount(numArguments))
        {
            return Fail(argNode, _u("Cannot have variable number of arguments"));
        }

        ArgSlot index = 0;
        while (argNode)
        {
            if (pnode->nop != knopList)
            {
                return Fail(pnode, _u("Missing assignment statement for argument"));
            }


            if (!ParserWrapper::IsDefinition(argNode))
            {
                return Fail(argNode, _u("duplicate argument name not allowed"));
            }

            PropertyName argName = argNode->name();
            if (!AsmJSCompiler::CheckIdentifier(*this, argNode, argName))
            {
                return false;
            }

            // creates the variable
            AsmJsVarBase* var = func->DefineVar(argName, true);
            if (!var)
            {
                return Fail(argNode, _u("Failed to define var"));
            }

            ParseNode* argDefinition = ParserWrapper::GetBinaryLeft(pnode);
            if (argDefinition->nop != knopAsg)
            {
                return Fail(argDefinition, _u("Expecting an assignment"));
            }

            ParseNode* lhs = ParserWrapper::GetBinaryLeft(argDefinition);
            ParseNode* rhs = ParserWrapper::GetBinaryRight(argDefinition);

#define NodeDefineThisArgument(n,var) (n->nop == knopName && ParserWrapper::VariableName(n)->GetPropertyId() == var->GetName()->GetPropertyId())

            if (!NodeDefineThisArgument(lhs, var))
            {
                return Fail(lhs, _u("Defining wrong argument"));
            }

            if (rhs->nop == knopPos)
            {
                // unary + => double
                var->SetVarType(AsmJsVarType::Double);
                var->SetLocation(func->AcquireRegister<double>());
                // validate stmt
                ParseNode* argSym = ParserWrapper::GetUnaryNode(rhs);

                if (!NodeDefineThisArgument(argSym, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
            }
            else if (rhs->nop == knopOr)
            {
                var->SetVarType(AsmJsVarType::Int);
                var->SetLocation(func->AcquireRegister<int>());

                ParseNode* argSym = ParserWrapper::GetBinaryLeft(rhs);
                ParseNode* intSym = ParserWrapper::GetBinaryRight(rhs);
                // validate stmt
                if (!NodeDefineThisArgument(argSym, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
                if (intSym->nop != knopInt || intSym->AsParseNodeInt()->lw != 0)
                {
                    return Fail(lhs, _u("Or value must be 0 when defining arguments"));
                }
            }
            else if (rhs->nop == knopCall)
            {
                ParseNodeCall* callNode = rhs->AsParseNodeCall();
                if (callNode->pnodeTarget->nop != knopName)
                {
                    return Fail(rhs, _u("call should be for fround"));
                }
                AsmJsFunctionDeclaration* funcDecl = this->LookupFunction(callNode->pnodeTarget->name());

                if (!funcDecl)
                    return Fail(rhs, _u("Cannot resolve function for argument definition, or wrong function"));

                if (AsmJsMathFunction::Is(funcDecl))
                {
                    if (!AsmJsMathFunction::IsFround(funcDecl))
                    {
                        return Fail(rhs, _u("call should be for fround"));
                    }
                    var->SetVarType(AsmJsVarType::Float);
                    var->SetLocation(func->AcquireRegister<float>());
                }
                else
                {
                    return Fail(rhs, _u("Wrong function used for argument definition"));
                }

                if (callNode->argCount == 0 || !NodeDefineThisArgument(callNode->pnodeArgs, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
            }
            else
            {
                return Fail(rhs, _u("arguments are not casted as valid Asm.js type"));
            }

            if (PHASE_TRACE1(ByteCodePhase))
            {
                Output::Print(_u("    Argument [%s] Valid"), argName->Psz());
            }

            if (!func->EnsureArgType(var, index++))
            {
                return Fail(rhs, _u("Unexpected argument type"));
            }

            argNode = ParserWrapper::NextVar(argNode);
            pnode = ParserWrapper::GetBinaryRight(pnode);
        }

        func->SetBodyNode(pnode);
        return true;
    }